

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanSyncObjectManager.hpp
# Opt level: O1

void __thiscall
VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::
SetUnsignaled(RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *this)

{
  char (*in_RCX) [16];
  string msg;
  string local_30;
  
  if (this->m_IsUnsignaled == true) {
    Diligent::FormatString<char[26],char[16]>
              (&local_30,(Diligent *)"Debug expression failed:\n",(char (*) [26])"!m_IsUnsignaled",
               in_RCX);
    Diligent::DebugAssertionFailed
              (local_30._M_dataplus._M_p,"SetUnsignaled",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanSyncObjectManager.hpp"
               ,0x8d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  this->m_IsUnsignaled = true;
  return;
}

Assistant:

void SetUnsignaled()
    {
        VERIFY_EXPR(!m_IsUnsignaled);
        m_IsUnsignaled = true;
    }